

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite_inl.h
# Opt level: O2

bool google::protobuf::internal::WireFormatLite::
     ReadMessageNoVirtual<google::protobuf::DescriptorProto>
               (CodedInputStream *input,DescriptorProto *value)

{
  int iVar1;
  bool bVar2;
  Limit limit;
  uint32 length;
  uint32 local_1c;
  
  bVar2 = io::CodedInputStream::ReadVarint32(input,&local_1c);
  if ((bVar2) &&
     (iVar1 = input->recursion_depth_, input->recursion_depth_ = iVar1 + 1,
     iVar1 < input->recursion_limit_)) {
    limit = io::CodedInputStream::PushLimit(input,local_1c);
    bVar2 = DescriptorProto::MergePartialFromCodedStream(value,input);
    if ((bVar2) && (input->legitimate_message_end_ == true)) {
      io::CodedInputStream::PopLimit(input,limit);
      if (input->recursion_depth_ < 1) {
        return true;
      }
      input->recursion_depth_ = input->recursion_depth_ + -1;
      return true;
    }
  }
  return false;
}

Assistant:

inline bool WireFormatLite::ReadMessageNoVirtual(
    io::CodedInputStream* input, MessageType_WorkAroundCppLookupDefect* value) {
  uint32 length;
  if (!input->ReadVarint32(&length)) return false;
  if (!input->IncrementRecursionDepth()) return false;
  io::CodedInputStream::Limit limit = input->PushLimit(length);
  if (!value->
      MessageType_WorkAroundCppLookupDefect::MergePartialFromCodedStream(input))
    return false;
  // Make sure that parsing stopped when the limit was hit, not at an endgroup
  // tag.
  if (!input->ConsumedEntireMessage()) return false;
  input->PopLimit(limit);
  input->DecrementRecursionDepth();
  return true;
}